

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O0

ReturnCode
failure_test::ool_detect_cb(atomic<bool> *invoked,size_t purge_upto,Type type,Param *params)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  anon_class_16_2_773b3edf chk_func;
  OutOfLogRangeWarningArgs *ool_args;
  anon_class_16_2_773b3edf *in_stack_00000118;
  Param *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  atomic<bool> *this;
  undefined4 local_4;
  
  if (in_EDX == 0xf) {
    this = *(atomic<bool> **)(in_RCX + 0x10);
    iVar1 = ool_detect_cb::anon_class_16_2_773b3edf::operator()(in_stack_00000118);
    if (iVar1 == 0) {
      std::atomic<bool>::store(this,SUB81((ulong)in_RSI >> 0x38,0),(memory_order)in_RSI);
    }
    local_4 = Ok;
  }
  else {
    local_4 = cb_default((Type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8)
    ;
  }
  return local_4;
}

Assistant:

cb_func::ReturnCode ool_detect_cb(std::atomic<bool>* invoked,
                                  size_t purge_upto,
                                  cb_func::Type type,
                                  cb_func::Param* params)
{
    if (type == cb_func::Type::OutOfLogRangeWarning) {
        cb_func::OutOfLogRangeWarningArgs* ool_args =
            (cb_func::OutOfLogRangeWarningArgs*)params->ctx;
        auto chk_func = [purge_upto, ool_args]() -> int {
            CHK_EQ(purge_upto + 1, ool_args->startIdxOfLeader);
            return 0;
        };
        if (chk_func() == 0) {
            invoked->store(true);
        }
    } else {
        return cb_default(type, params);
    }

    return cb_func::ReturnCode::Ok;
}